

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::_internal_add_outputshape
          (RandomNormalStaticLayerParams *this,uint64_t value)

{
  uint64_t local_18;
  uint64_t value_local;
  RandomNormalStaticLayerParams *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->outputshape_,&local_18);
  return;
}

Assistant:

inline void RandomNormalStaticLayerParams::_internal_add_outputshape(uint64_t value) {
  outputshape_.Add(value);
}